

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestVat::ConnectionImpl::unblock(ConnectionImpl *this)

{
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> **ppOVar1;
  PromiseFulfiller<void> *pPVar2;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> local_50;
  undefined1 local_39;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *local_38;
  Fault local_20;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *local_18;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *_kj_result;
  ConnectionImpl *this_local;
  
  _kj_result = (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)this;
  local_18 = kj::_::readMaybe<kj::PromiseFulfiller<void>,decltype(nullptr)>
                       (&this->currentBlockFulfiller);
  if (local_18 != (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)0x0) {
    ppOVar1 = kj::mv<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>*>(&local_18);
    local_38 = *ppOVar1;
    pPVar2 = kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator->(local_38);
    (*(pPVar2->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar2,&local_39);
    kj::Maybe<kj::ForkedPromise<void>_>::operator=(&this->currentBlock);
    kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::Maybe();
    kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::operator=
              (&this->currentBlockFulfiller,&local_50);
    kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::~Maybe(&local_50);
    return;
  }
  kj::_::Debug::Fault::Fault
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
             ,0x14a,FAILED,"currentBlockFulfiller != nullptr","");
  kj::_::Debug::Fault::fatal(&local_20);
}

Assistant:

void unblock() {
      // Allow blocked messages to proceed.
      KJ_REQUIRE_NONNULL(currentBlockFulfiller)->fulfill();
      currentBlock = kj::none;
      currentBlockFulfiller = kj::none;
    }